

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O3

void reoProfileNodesStart(reo_man *p)

{
  uint uVar1;
  int iVar2;
  reo_plane *prVar3;
  int iVar4;
  long lVar5;
  
  uVar1 = p->nSupp;
  if ((int)uVar1 < 0) {
    iVar4 = 0;
  }
  else {
    prVar3 = p->pPlanes;
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar2 = *(int *)((long)&prVar3->statsNodes + lVar5);
      *(double *)((long)&prVar3->statsCost + lVar5) = (double)iVar2;
      iVar4 = iVar4 + iVar2;
      lVar5 = lVar5 + 0x38;
    } while ((ulong)uVar1 * 0x38 + 0x38 != lVar5);
  }
  if (iVar4 != p->nNodesCur) {
    __assert_fail("Total == p->nNodesCur",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/reo/reoProfile.c"
                  ,0x37,"void reoProfileNodesStart(reo_man *)");
  }
  p->nNodesBeg = iVar4;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////


/**Function********************************************************************

  Synopsis    [Start the profile for the BDD nodes.]

  Description [TopRef is the first level, on this the given node counts towards 
  the width of the BDDs. (In other words, it is the level of the referencing node plus 1.)]

  SideEffects []

  SeeAlso     []

******************************************************************************/
void reoProfileNodesStart( reo_man * p )
{
	int Total, i;
	Total = 0;
	for ( i = 0; i <= p->nSupp; i++ )
	{
		p->pPlanes[i].statsCost = p->pPlanes[i].statsNodes;
		Total += p->pPlanes[i].statsNodes;
	}
	assert( Total == p->nNodesCur );
	p->nNodesBeg = p->nNodesCur;
}